

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t exr_set_name(exr_context_t ctxt,int part_index,char *val)

{
  exr_attribute_t **attr;
  pthread_mutex_t *__mutex;
  exr_priv_part_t p_Var1;
  exr_attribute_t *peVar2;
  exr_attribute_t *peVar3;
  exr_attr_string_t *s;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  exr_result_t eVar7;
  int iVar8;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  size_t __n;
  exr_context_t nonc;
  ulong uVar9;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  uVar5 = (ulong)(uint)part_index;
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar7 = (*ctxt->print_error)(ctxt,4,"Part index (%d) out of range",uVar5,ctxt->print_error);
    return eVar7;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar7 = 0x15;
  }
  else {
    if (ctxt->mode != '\0') {
      p_Var1 = ctxt->parts[uVar5];
      attr = &p_Var1->name;
      if (p_Var1->name == (exr_attribute_t *)0x0) {
        eVar7 = exr_attr_list_add(ctxt,&p_Var1->attributes,"name",EXR_ATTR_STRING,0,(uint8_t **)0x0,
                                  attr);
      }
      else {
        eVar7 = 0;
        if (p_Var1->name->type != EXR_ATTR_STRING) {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          eVar7 = (*ctxt->print_error)
                            (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             (*attr)->type_name,"name",ctxt->print_error);
          return eVar7;
        }
      }
      if (val == (char *)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        eVar7 = (*ctxt->report_error)(ctxt,3,"Invalid string passed trying to set \'name\'");
        return eVar7;
      }
      peVar2 = *attr;
      __n = strlen(val);
      if (0x7ffffffe < __n) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        eVar7 = (*ctxt->print_error)
                          (ctxt,3,"String too large to store (%lu bytes) into \'name\'",__n,
                           ctxt->print_error);
        return eVar7;
      }
      if (eVar7 == 0) {
        if (1 < ctxt->num_parts) {
          bVar4 = 0 < ctxt->num_parts;
          eVar7 = 0;
          if (0 < ctxt->num_parts) {
            uVar9 = 0;
            do {
              bVar6 = false;
              if (uVar5 != uVar9) {
                peVar3 = ctxt->parts[uVar9]->name;
                if (peVar3 == (exr_attribute_t *)0x0) {
                  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                  eVar7 = (*ctxt->print_error)
                                    (ctxt,3,
                                     "Part %d missing required attribute \'name\' for multi-part file"
                                     ,uVar9 & 0xffffffff);
                }
                else {
                  iVar8 = strcmp(val,((peVar3->field_6).string)->str);
                  bVar6 = false;
                  if (iVar8 != 0) goto LAB_0011ee6e;
                  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                  eVar7 = (*ctxt->print_error)
                                    (ctxt,3,
                                     "Each part should have a unique name, part %d and %d attempting to have same name \'%s\'"
                                     ,uVar9 & 0xffffffff,uVar5,val);
                }
                bVar6 = true;
              }
LAB_0011ee6e:
              if (bVar6) break;
              uVar9 = uVar9 + 1;
              bVar4 = (long)uVar9 < (long)ctxt->num_parts;
            } while ((long)uVar9 < (long)ctxt->num_parts);
          }
          if (bVar4) {
            return eVar7;
          }
        }
        s = (peVar2->field_6).string;
        if ((s->length == (int)__n) && (0 < s->alloc_size)) {
          memcpy(s->str,val,__n);
          eVar7 = 0;
        }
        else {
          if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            eVar7 = (*ctxt->print_error)
                              (ctxt,0x14,
                               "Existing string \'name\' has length %d, requested %d, unable to change"
                               ,(ulong)((peVar2->field_6).preview)->width,__n & 0xffffffff,
                               ctxt->print_error);
            return eVar7;
          }
          eVar7 = exr_attr_string_set_with_length(ctxt,s,val,(int)__n);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return eVar7;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar7 = 8;
  }
  eVar7 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar7);
  return eVar7;
}

Assistant:

exr_result_t
exr_set_name (exr_context_t ctxt, int part_index, const char* val)
{
    size_t bytes;
    REQ_ATTR_FIND_CREATE (name, EXR_ATTR_STRING);

    /* old library allowed an empty string :(, but ensure not null */
    if (!val)
        return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid string passed trying to set 'name'"));

    bytes = strlen (val);

    if (bytes >= (size_t) INT32_MAX)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "String too large to store (%" PRIu64 " bytes) into 'name'",
            (uint64_t) bytes));

    if (rv == EXR_ERR_SUCCESS)
    {
        if (ctxt->num_parts > 1)
        {
            for ( int pidx = 0; pidx < ctxt->num_parts; ++pidx )
            {
                const exr_attribute_t* pname;

                if (pidx == part_index)
                    continue;
                pname = ctxt->parts[pidx]->name;
                if (!pname)
                {
                    return EXR_UNLOCK_AND_RETURN (
                        ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "Part %d missing required attribute 'name' for multi-part file",
                            pidx));
                }
                if (!strcmp (val, pname->string->str))
                {
                    return EXR_UNLOCK_AND_RETURN (
                        ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "Each part should have a unique name, part %d and %d attempting to have same name '%s'",
                            pidx, part_index, val));
                }
            }
        }

        if (attr->string->length == (int32_t) bytes &&
            attr->string->alloc_size > 0)
        {
            /* we own the string... */
            memcpy (EXR_CONST_CAST (void*, attr->string->str), val, bytes);
        }
        else if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
        {
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing string 'name' has length %d, requested %d, unable to change",
                attr->string->length,
                (int32_t) bytes));
        }
        else
        {
            rv = exr_attr_string_set_with_length (
                ctxt, attr->string, val, (int32_t) bytes);
        }
    }

    return EXR_UNLOCK_AND_RETURN (rv);
}